

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

int Pdr_NtkFindSatAssign_rec(Aig_Man_t *pAig,Aig_Obj_t *pNode,int Value,Pdr_Set_t *pCube,int Heur)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int Value1;
  int Value0;
  int Heur_local;
  Pdr_Set_t *pCube_local;
  int Value_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsConst1(pNode);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsTravIdCurrent(pAig,pNode);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(pAig,pNode);
      *(ulong *)&pNode->field_0x18 =
           *(ulong *)&pNode->field_0x18 & 0xffffffffffffffef | ((ulong)(uint)Value & 1) << 4;
      iVar1 = Aig_ObjIsCi(pNode);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pNode);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                        ,0x287,
                        "int Pdr_NtkFindSatAssign_rec(Aig_Man_t *, Aig_Obj_t *, int, Pdr_Set_t *, int)"
                       );
        }
        if (Value == 0) {
          pAVar3 = Aig_ObjFanin0(pNode);
          iVar1 = Aig_ObjFaninC0(pNode);
          iVar1 = Pdr_ObjSatValue(pAig,pAVar3,iVar1);
          if (iVar1 == 1) {
            pAig_local._4_4_ = 1;
          }
          else {
            pAVar3 = Aig_ObjFanin1(pNode);
            iVar2 = Aig_ObjFaninC1(pNode);
            iVar2 = Pdr_ObjSatValue(pAig,pAVar3,iVar2);
            if (iVar2 == 1) {
              pAig_local._4_4_ = 1;
            }
            else if ((iVar1 == 2) && (iVar2 == 2)) {
              pAig_local._4_4_ = 0;
            }
            else if (iVar1 == 2) {
              pAVar3 = Aig_ObjFanin1(pNode);
              iVar1 = Aig_ObjFaninC1(pNode);
              pAig_local._4_4_ = Pdr_NtkFindSatAssign_rec(pAig,pAVar3,iVar1,pCube,Heur);
            }
            else if (iVar2 == 2) {
              pAVar3 = Aig_ObjFanin0(pNode);
              iVar1 = Aig_ObjFaninC0(pNode);
              pAig_local._4_4_ = Pdr_NtkFindSatAssign_rec(pAig,pAVar3,iVar1,pCube,Heur);
            }
            else {
              if ((iVar1 != 3) || (iVar2 != 3)) {
                __assert_fail("Value0 == PDR_VALX && Value1 == PDR_VALX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                              ,0x29c,
                              "int Pdr_NtkFindSatAssign_rec(Aig_Man_t *, Aig_Obj_t *, int, Pdr_Set_t *, int)"
                             );
              }
              iVar1 = Aig_ObjId(pNode);
              if (iVar1 % 4 == Heur) {
                pAVar3 = Aig_ObjFanin1(pNode);
                iVar1 = Aig_ObjFaninC1(pNode);
                pAig_local._4_4_ = Pdr_NtkFindSatAssign_rec(pAig,pAVar3,iVar1,pCube,Heur);
              }
              else {
                pAVar3 = Aig_ObjFanin0(pNode);
                iVar1 = Aig_ObjFaninC0(pNode);
                pAig_local._4_4_ = Pdr_NtkFindSatAssign_rec(pAig,pAVar3,iVar1,pCube,Heur);
              }
            }
          }
        }
        else {
          pAVar3 = Aig_ObjFanin0(pNode);
          iVar1 = Aig_ObjFaninC0(pNode);
          iVar1 = Pdr_NtkFindSatAssign_rec(pAig,pAVar3,(uint)((iVar1 != 0 ^ 0xffU) & 1),pCube,Heur);
          if (iVar1 == 0) {
            pAig_local._4_4_ = 0;
          }
          else {
            pAVar3 = Aig_ObjFanin1(pNode);
            iVar1 = Aig_ObjFaninC1(pNode);
            pAig_local._4_4_ =
                 Pdr_NtkFindSatAssign_rec(pAig,pAVar3,(uint)((iVar1 != 0 ^ 0xffU) & 1),pCube,Heur);
          }
        }
      }
      else {
        iVar1 = Saig_ObjIsLo(pAig,pNode);
        if (iVar1 != 0) {
          iVar1 = Aig_ObjCioId(pNode);
          iVar2 = Saig_ManPiNum(pAig);
          iVar2 = Abc_Var2Lit(iVar1 - iVar2,Value);
          iVar1 = pCube->nLits;
          pCube->nLits = iVar1 + 1;
          *(int *)(&pCube->field_0x14 + (long)iVar1 * 4) = iVar2;
          pCube->Sign = 1L << ((byte)((long)*(int *)(&pCube->field_0x14 +
                                                    (long)(pCube->nLits + -1) * 4) % 0x3f) & 0x3f) |
                        pCube->Sign;
        }
        pAig_local._4_4_ = 1;
      }
    }
    else {
      pAig_local._4_4_ = (uint)(((uint)(*(ulong *)&pNode->field_0x18 >> 4) & 1) == Value);
    }
  }
  else {
    pAig_local._4_4_ = 1;
  }
  return pAig_local._4_4_;
}

Assistant:

int Pdr_NtkFindSatAssign_rec( Aig_Man_t * pAig, Aig_Obj_t * pNode, int Value, Pdr_Set_t * pCube, int Heur )
{
    int Value0, Value1;
    if ( Aig_ObjIsConst1(pNode) )
        return 1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pNode) )
        return ((int)pNode->fMarkA == Value);
    Aig_ObjSetTravIdCurrent(pAig, pNode);
    pNode->fMarkA = Value;
    if ( Aig_ObjIsCi(pNode) )
    {
//        if ( vSuppLits )
//            Vec_IntPush( vSuppLits, Abc_Var2Lit( Aig_ObjCioId(pNode), !Value ) );
        if ( Saig_ObjIsLo(pAig, pNode) )
        {
//            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), !Value );
            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), Value );
            pCube->Sign |= ((word)1 << (pCube->Lits[pCube->nLits-1] % 63));
        }
        return 1;
    }
    assert( Aig_ObjIsNode(pNode) );
    // propagation
    if ( Value ) 
    {
        if ( !Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), !Aig_ObjFaninC0(pNode), pCube, Heur) )
            return 0;
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), !Aig_ObjFaninC1(pNode), pCube, Heur);
    }
    // justification
    Value0 = Pdr_ObjSatValue( pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode) );
    if ( Value0 == PDR_VAL0 )
        return 1;
    Value1 = Pdr_ObjSatValue( pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode) );
    if ( Value1 == PDR_VAL0 )
        return 1;
    if ( Value0 == PDR_VAL1 && Value1 == PDR_VAL1 )
        return 0;
    if ( Value0 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    if ( Value1 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
    assert( Value0 == PDR_VALX && Value1 == PDR_VALX );
    // decision making
//    if ( rand() % 10 == Heur )
    if ( Aig_ObjId(pNode) % 4 == Heur )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    else
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
}